

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_123::AsyncPipe::shutdownWrite(AsyncPipe *this)

{
  RefOrVoid<kj::AsyncCapabilityStream> other;
  Own<kj::(anonymous_namespace)::AsyncPipe::ShutdownedWrite,_std::nullptr_t> local_40;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_30;
  AsyncCapabilityStream *local_20;
  AsyncCapabilityStream *s;
  AsyncCapabilityStream *_s391;
  AsyncPipe *this_local;
  
  _s391 = &this->super_AsyncCapabilityStream;
  local_20 = kj::_::readMaybe<kj::AsyncCapabilityStream>(&this->state);
  s = local_20;
  if (local_20 == (AsyncCapabilityStream *)0x0) {
    heap<kj::(anonymous_namespace)::AsyncPipe::ShutdownedWrite>();
    Own<kj::AsyncCapabilityStream,decltype(nullptr)>::
    Own<kj::(anonymous_namespace)::AsyncPipe::ShutdownedWrite,void>
              ((Own<kj::AsyncCapabilityStream,decltype(nullptr)> *)&local_30,&local_40);
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator=(&this->ownState,&local_30);
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::~Own(&local_30);
    Own<kj::(anonymous_namespace)::AsyncPipe::ShutdownedWrite,_std::nullptr_t>::~Own(&local_40);
    other = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator*(&this->ownState);
    Maybe<kj::AsyncCapabilityStream_&>::operator=(&this->state,other);
  }
  else {
    (*(local_20->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[6])();
  }
  return;
}

Assistant:

void shutdownWrite() override {
    KJ_IF_SOME(s, state) {
      s.shutdownWrite();
    } else {
      ownState = kj::heap<ShutdownedWrite>();
      state = *ownState;
    }